

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

bool __thiscall GEO::Delaunay2d::triangle_is_conflict(Delaunay2d *this,index_t t,double *p)

{
  double h0_00;
  double h1_00;
  double h2_00;
  undefined1 auVar1 [16];
  bool bVar2;
  index_t iVar3;
  Sign SVar4;
  double *pdVar5;
  double *local_98;
  double h;
  index_t pindex;
  double h2;
  double h1;
  double h0;
  index_t t2;
  Sign sign;
  index_t le;
  signed_index_t v;
  index_t i;
  double *pv [3];
  double *p_local;
  index_t t_local;
  Delaunay2d *this_local;
  
  for (le = 0; le < 3; le = le + 1) {
    iVar3 = triangle_vertex(this,t,le);
    if (iVar3 == 0xffffffff) {
      local_98 = (double *)0x0;
    }
    else {
      local_98 = Delaunay::vertex_ptr(&this->super_Delaunay,iVar3);
    }
    *(double **)(&v + (ulong)le * 2) = local_98;
  }
  t2 = 0;
  while( true ) {
    if (2 < t2) {
      if ((this->weighted_ & 1U) == 0) {
        SVar4 = PCK::in_circle_2d_SOS(_v,pv[0],pv[1],p);
      }
      else {
        iVar3 = finite_triangle_vertex(this,t,0);
        pdVar5 = vector<double>::operator[](&this->heights_,iVar3);
        h0_00 = *pdVar5;
        iVar3 = finite_triangle_vertex(this,t,1);
        pdVar5 = vector<double>::operator[](&this->heights_,iVar3);
        h1_00 = *pdVar5;
        iVar3 = finite_triangle_vertex(this,t,2);
        pdVar5 = vector<double>::operator[](&this->heights_,iVar3);
        h2_00 = *pdVar5;
        pdVar5 = Delaunay::vertex_ptr(&this->super_Delaunay,0);
        auVar1._8_8_ = (long)p - (long)pdVar5 >> 0x3f;
        auVar1._0_8_ = (long)p - (long)pdVar5 >> 3;
        pdVar5 = vector<double>::operator[]
                           (&this->heights_,
                            SUB164(auVar1 / SEXT816((long)(int)(this->super_Delaunay).vertex_stride_
                                                   ),0));
        SVar4 = PCK::orient_2dlifted_SOS(_v,pv[0],pv[1],p,h0_00,h1_00,h2_00,*pdVar5);
      }
      this_local._7_1_ = ZERO < SVar4;
      return this_local._7_1_;
    }
    if (*(long *)(&v + (ulong)t2 * 2) == 0) break;
    t2 = t2 + 1;
  }
  *(double **)(&v + (ulong)t2 * 2) = p;
  SVar4 = PCK::orient_2d(_v,pv[0],pv[1]);
  if (ZERO < SVar4) {
    return true;
  }
  if (SVar4 < ZERO) {
    return false;
  }
  iVar3 = triangle_adjacent(this,t,t2);
  bVar2 = triangle_is_in_list(this,iVar3);
  if (!bVar2) {
    bVar2 = triangle_is_marked(this,iVar3);
    if (!bVar2) {
      bVar2 = triangle_is_conflict(this,iVar3,p);
      return bVar2;
    }
    return false;
  }
  return true;
}

Assistant:

bool triangle_is_conflict(index_t t, const double* p) const {

            // Lookup triangle vertices
            const double* pv[3];
            for(index_t i=0; i<3; ++i) {
                signed_index_t v = triangle_vertex(t,i);
                pv[i] = (v == -1) ? nullptr : vertex_ptr(index_t(v));
            }

            // Check for virtual triangles (then in_circle()
            // is replaced with orient2d())
            for(index_t le = 0; le < 3; ++le) {

                if(pv[le] == nullptr) {

                    // Facet of a virtual triangle opposite to
                    // infinite vertex corresponds to
                    // the triangle on the convex hull of the points.
                    // Orientation is obtained by replacing vertex lf
                    // with p.
                    pv[le] = p;
                    Sign sign = PCK::orient_2d(pv[0],pv[1],pv[2]);

                    if(sign > 0) {
                        return true;
                    }

                    if(sign < 0) {
                        return false;
                    }

                    // If sign is zero, we check the real triangle
                    // adjacent to the facet on the convex hull.
                    geo_debug_assert(triangle_adjacent(t, le) >= 0);
                    index_t t2 = index_t(triangle_adjacent(t, le));
                    geo_debug_assert(!triangle_is_virtual(t2));

                    //  If t2 is already chained in the conflict list,
                    // then it is conflict
                    if(triangle_is_in_list(t2)) {
                        return true;
                    }

                    //  If t2 is marked, then it is not in conflict.
                    if(triangle_is_marked(t2)) {
                        return false;
                    }

                    return triangle_is_conflict(t2, p);
                }
            }

            //   If the triangle is a finite one, it is in conflict
            // if its circumscribed sphere contains the point (this is
            // the standard case).

            if(weighted_) {
                double h0 = heights_[finite_triangle_vertex(t, 0)];
                double h1 = heights_[finite_triangle_vertex(t, 1)];
                double h2 = heights_[finite_triangle_vertex(t, 2)];
                index_t pindex = index_t(
                    (p - vertex_ptr(0)) / int(vertex_stride_)
                );
                double h = heights_[pindex];
                return (PCK::orient_2dlifted_SOS(
                            pv[0],pv[1],pv[2],p,h0,h1,h2,h
                       ) > 0) ;
            }

            return (PCK::in_circle_2d_SOS(pv[0], pv[1], pv[2], p) > 0);
        }